

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

int use_misc(monst *mtmp,musable *m)

{
  byte bVar1;
  obj *poVar2;
  level *plVar3;
  byte bVar4;
  schar sVar5;
  xchar tolev_00;
  boolean bVar6;
  int iVar7;
  permonst *ppVar8;
  trap *trap;
  char *pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  char *local_298;
  bool local_26c;
  char local_268 [8];
  char the_weapon [256];
  char *local_160;
  char *hand;
  obj *obj;
  int where_to;
  char *The_whip;
  char local_138 [2];
  d_level tolevel;
  int tolev;
  char nambuf [256];
  boolean oseen;
  boolean vismon;
  boolean vis;
  obj *otmp;
  int i;
  musable *m_local;
  monst *mtmp_local;
  
  poVar2 = m->misc;
  iVar7 = precheck(mtmp,poVar2,m);
  if (iVar7 != 0) {
    return iVar7;
  }
  bVar1 = viz_array[mtmp->my][mtmp->mx];
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((bVar13 = false, ublindf == (obj *)0x0 || (bVar13 = false, ublindf->oartifact != '\x1d'))
          )) || (((u.uprops[0x40].intrinsic == 0 &&
                  ((u.uprops[0x40].extrinsic == 0 &&
                   (bVar13 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
                 (bVar13 = false, (mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_002684c0;
      bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x002683f5;
    }
  }
  else {
    bVar4 = worm_known(level,mtmp);
joined_r0x002683f5:
    bVar13 = false;
    if (bVar4 == 0) goto LAB_002684c0;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (bVar13 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (bVar13 = false, (*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0)) {
    bVar13 = (*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
  }
LAB_002684c0:
  bVar12 = poVar2 != (obj *)0x0;
  local_26c = bVar12 && bVar13;
  switch(m->has_misc) {
  case MUSE_NONE:
    mtmp_local._4_4_ = 0;
    break;
  default:
    pcVar10 = Monnam(mtmp);
    warning("%s wanted to perform action %d?",pcVar10,(ulong)m->has_misc);
    mtmp_local._4_4_ = 0;
    break;
  case MUSE_POT_GAIN_LEVEL:
    mquaffmsg(mtmp,poVar2);
    if ((*(uint *)&poVar2->field_0x4a & 1) == 0) {
      if (bVar13) {
        pcVar10 = Monnam(mtmp);
        pline("%s seems more experienced.",pcVar10);
      }
      if (local_26c) {
        discover_object(299,'\x01','\x01');
      }
      m_useup(mtmp,poVar2);
      ppVar8 = grow_up(mtmp,(monst *)0x0);
      if (ppVar8 == (permonst *)0x0) {
        mtmp_local._4_4_ = 1;
      }
      else {
        mtmp_local._4_4_ = 2;
      }
    }
    else {
      bVar6 = Can_rise_up(level,(int)mtmp->mx,(int)mtmp->my);
      if (bVar6 != '\0') {
        sVar5 = depth(&u.uz);
        The_whip._4_4_ = sVar5 + -1;
        get_level((d_level *)((long)&The_whip + 2),The_whip._4_4_);
        bVar6 = on_level((d_level *)((long)&The_whip + 2),&u.uz);
        if (bVar6 == '\0') {
          if (bVar13) {
            pcVar10 = Monnam(mtmp);
            pcVar9 = ceiling((int)mtmp->mx,(int)mtmp->my);
            pline("%s rises up, through the %s!",pcVar10,pcVar9);
            if (((objects[299].field_0x10 & 1) == 0) && (objects[299].oc_uname == (char *)0x0)) {
              docall(poVar2);
            }
          }
          m_useup(mtmp,poVar2);
          tolev_00 = ledger_no((d_level *)((long)&The_whip + 2));
          migrate_to_level(mtmp,tolev_00,'\0',(coord *)0x0);
          return 2;
        }
      }
      if (bVar13) {
        pcVar10 = Monnam(mtmp);
        pline("%s looks uneasy.",pcVar10);
        if (((objects[299].field_0x10 & 1) == 0) && (objects[299].oc_uname == (char *)0x0)) {
          docall(poVar2);
        }
      }
      m_useup(mtmp,poVar2);
      mtmp_local._4_4_ = 2;
    }
    break;
  case MUSE_WAN_MAKE_INVISIBLE:
  case MUSE_POT_INVISIBILITY:
    if (poVar2->otyp == 0x1c5) {
      mzapmsg(mtmp,poVar2,'\x01');
      poVar2->spe = poVar2->spe + -1;
    }
    else {
      mquaffmsg(mtmp,poVar2);
    }
    if (((u.uprops[0xc].intrinsic == 0) && (u.uprops[0xc].extrinsic == 0)) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      local_298 = mon_nam(mtmp);
    }
    else {
      local_298 = Monnam(mtmp);
    }
    strcpy(local_138,local_298);
    mon_set_minvis(mtmp);
    if ((bVar13) && ((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0)) {
      if ((u.uprops[0xc].intrinsic == 0) &&
         ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
        pline("Suddenly you cannot see %s.",local_138);
      }
      else {
        pcVar10 = s_suffix(local_138);
        bVar13 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar13 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar13 = false, u.umonnum != u.umonster)) {
            bVar6 = dmgtype(youmonst.data,0x24);
            bVar13 = bVar6 != '\0';
          }
          bVar13 = (bool)(bVar13 ^ 1);
        }
        pcVar9 = "strange";
        if (bVar13) {
          pcVar9 = "normal";
        }
        pline("%s body takes on a %s transparency.",pcVar10,pcVar9);
      }
      if (local_26c) {
        discover_object((int)poVar2->otyp,'\x01','\x01');
      }
    }
    if (poVar2->otyp == 0x135) {
      if ((*(uint *)&poVar2->field_0x4a & 1) != 0) {
        you_aggravate(mtmp);
      }
      m_useup(mtmp,poVar2);
    }
    mtmp_local._4_4_ = 2;
    break;
  case MUSE_POLY_TRAP:
    if (bVar13) {
      pcVar10 = Monnam(mtmp);
      pcVar9 = locomotion(mtmp->data,"jump");
      pcVar9 = makeplural(pcVar9);
      pline("%s deliberately %s onto a polymorph trap!",pcVar10,pcVar9);
    }
    if ((bVar1 & 2) != 0) {
      trap = t_at(level,trapx,trapy);
      seetrap(trap);
    }
    remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
    newsym((int)mtmp->mx,(int)mtmp->my);
    place_monster(mtmp,trapx,trapy);
    if (mtmp->wormno != '\0') {
      worm_move(mtmp);
    }
    newsym(trapx,trapy);
    newcham(level,mtmp,(permonst *)0x0,'\0','\0');
    mtmp_local._4_4_ = 2;
    break;
  case MUSE_WAN_POLYMORPH:
    mzapmsg(mtmp,poVar2,'\x01');
    poVar2->spe = poVar2->spe + -1;
    plVar3 = level;
    ppVar8 = muse_newcham_mon(mtmp);
    newcham(plVar3,mtmp,ppVar8,'\x01','\0');
    if (bVar12 && bVar13) {
      discover_object(0x1c9,'\x01','\x01');
    }
    mtmp_local._4_4_ = 2;
    break;
  case MUSE_POT_SPEED:
    mquaffmsg(mtmp,poVar2);
    mon_adjust_speed(mtmp,1,poVar2);
    m_useup(mtmp,poVar2);
    mtmp_local._4_4_ = 2;
    break;
  case MUSE_WAN_SPEED_MONSTER:
    mzapmsg(mtmp,poVar2,'\x01');
    poVar2->spe = poVar2->spe + -1;
    mon_adjust_speed(mtmp,1,poVar2);
    mtmp_local._4_4_ = 2;
    break;
  case MUSE_BULLWHIP:
    if ((uwep == (obj *)0x0) || (iVar7 = rn2(5), iVar7 != 0)) {
      mtmp_local._4_4_ = 0;
    }
    else {
      pcVar10 = "A whip";
      if (bVar13) {
        pcVar10 = "The bullwhip";
      }
      obj._4_4_ = rn2(4);
      poVar2 = uwep;
      pcVar9 = xname(uwep);
      pcVar9 = the(pcVar9);
      strcpy(local_268,pcVar9);
      local_160 = body_part(6);
      if (((poVar2->oclass == '\x02') || (poVar2->oclass == '\x06')) &&
         ((*(ushort *)&objects[poVar2->otyp].field_0x11 & 1) != 0)) {
        local_160 = makeplural(local_160);
      }
      if (bVar13) {
        pcVar9 = Monnam(mtmp);
        pline("%s flicks a bullwhip towards your %s!",pcVar9,local_160);
      }
      if (poVar2->otyp == 0x216) {
        pline("%s fails to wrap around %s.",pcVar10,local_268);
        mtmp_local._4_4_ = 1;
      }
      else {
        pline("%s wraps around %s you\'re wielding!",pcVar10,local_268);
        iVar7 = welded(poVar2);
        if (iVar7 != 0) {
          bVar13 = true;
          if (poVar2->quan < 2) {
            bVar13 = poVar2->oartifact == '\x1d';
          }
          pcVar10 = "They are";
          if (!bVar13) {
            pcVar10 = "It is";
          }
          uVar11 = 0x2e;
          if ((*(uint *)&poVar2->field_0x4a >> 6 & 1) == 0) {
            uVar11 = 0x21;
          }
          pline("%s welded to your %s%c",pcVar10,local_160,uVar11);
          obj._4_4_ = 0;
        }
        if (obj._4_4_ == 0) {
          pline("The whip slips free.");
          mtmp_local._4_4_ = 1;
        }
        else {
          if (((obj._4_4_ == 3) && (bVar6 = hates_silver(mtmp->data), bVar6 != '\0')) &&
             ((*(ushort *)&objects[poVar2->otyp].field_0x11 >> 4 & 0x1f) == 0xe)) {
            obj._4_4_ = 2;
          }
          freeinv(poVar2);
          uwepgone();
          if (obj._4_4_ == 1) {
            pcVar10 = Monnam(mtmp);
            pline("%s yanks %s from your %s!",pcVar10,local_268,local_160);
            place_object(poVar2,level,(int)mtmp->mx,(int)mtmp->my);
          }
          else if (obj._4_4_ == 2) {
            pcVar10 = Monnam(mtmp);
            pcVar9 = surface((int)u.ux,(int)u.uy);
            pline("%s yanks %s to the %s!",pcVar10,local_268,pcVar9);
            dropy(poVar2);
          }
          else if (obj._4_4_ == 3) {
            pcVar10 = Monnam(mtmp);
            pline("%s snatches %s!",pcVar10,local_268);
            mpickobj(mtmp,poVar2);
          }
          mtmp_local._4_4_ = 1;
        }
      }
    }
    break;
  case MUSE_POT_POLYMORPH:
    mquaffmsg(mtmp,poVar2);
    if (bVar13) {
      pcVar10 = Monnam(mtmp);
      pline("%s suddenly mutates!",pcVar10);
    }
    plVar3 = level;
    ppVar8 = muse_newcham_mon(mtmp);
    newcham(plVar3,mtmp,ppVar8,'\0','\0');
    if (bVar12 && bVar13) {
      discover_object(0x13a,'\x01','\x01');
    }
    m_useup(mtmp,poVar2);
    mtmp_local._4_4_ = 2;
  }
  return mtmp_local._4_4_;
}

Assistant:

int use_misc(struct monst *mtmp, struct musable *m)
{
	int i;
	struct obj *otmp = m->misc;
	boolean vis, vismon, oseen;
	char nambuf[BUFSZ];

	if ((i = precheck(mtmp, otmp, m)) != 0) return i;
	vis = cansee(mtmp->mx, mtmp->my);
	vismon = canseemon(level, mtmp);
	oseen = otmp && vismon;

	switch(m->has_misc) {
	case MUSE_POT_GAIN_LEVEL:
		mquaffmsg(mtmp, otmp);
		if (otmp->cursed) {
		    if (Can_rise_up(level, mtmp->mx, mtmp->my)) {
			int tolev = depth(&u.uz)-1;
			d_level tolevel;

			get_level(&tolevel, tolev);
			/* insurance against future changes... */
			if (on_level(&tolevel, &u.uz)) goto skipmsg;
			if (vismon) {
			    pline("%s rises up, through the %s!",
				  Monnam(mtmp), ceiling(mtmp->mx, mtmp->my));
			    if (!objects[POT_GAIN_LEVEL].oc_name_known
			      && !objects[POT_GAIN_LEVEL].oc_uname)
				docall(otmp);
			}
			m_useup(mtmp, otmp);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
			return 2;
		    } else {
skipmsg:
			if (vismon) {
			    pline("%s looks uneasy.", Monnam(mtmp));
			    if (!objects[POT_GAIN_LEVEL].oc_name_known
			      && !objects[POT_GAIN_LEVEL].oc_uname)
				docall(otmp);
			}
			m_useup(mtmp, otmp);
			return 2;
		    }
		}
		if (vismon) pline("%s seems more experienced.", Monnam(mtmp));
		if (oseen) makeknown(POT_GAIN_LEVEL);
		m_useup(mtmp, otmp);
		if (!grow_up(mtmp,NULL)) return 1;
			/* grew into genocided monster */
		return 2;
	case MUSE_WAN_MAKE_INVISIBLE:
	case MUSE_POT_INVISIBILITY:
		if (otmp->otyp == WAN_MAKE_INVISIBLE) {
		    mzapmsg(mtmp, otmp, TRUE);
		    otmp->spe--;
		} else
		    mquaffmsg(mtmp, otmp);
		/* format monster's name before altering its visibility */
		strcpy(nambuf, See_invisible ? Monnam(mtmp) : mon_nam(mtmp));
		mon_set_minvis(mtmp);
		if (vismon && mtmp->minvis) {	/* was seen, now invisible */
		    if (See_invisible)
			pline("%s body takes on a %s transparency.",
			      s_suffix(nambuf),
			      Hallucination ? "normal" : "strange");
		    else
			pline("Suddenly you cannot see %s.", nambuf);
		    if (oseen) makeknown(otmp->otyp);
		}
		if (otmp->otyp == POT_INVISIBILITY) {
		    if (otmp->cursed) you_aggravate(mtmp);
		    m_useup(mtmp, otmp);
		}
		return 2;
	case MUSE_WAN_SPEED_MONSTER:
		mzapmsg(mtmp, otmp, TRUE);
		otmp->spe--;
		mon_adjust_speed(mtmp, 1, otmp);
		return 2;
	case MUSE_POT_SPEED:
		mquaffmsg(mtmp, otmp);
		/* note difference in potion effect due to substantially
		   different methods of maintaining speed ratings:
		   player's character becomes "very fast" temporarily;
		   monster becomes "one stage faster" permanently */
		mon_adjust_speed(mtmp, 1, otmp);
		m_useup(mtmp, otmp);
		return 2;
	case MUSE_WAN_POLYMORPH:
		mzapmsg(mtmp, otmp, TRUE);
		otmp->spe--;
		newcham(level, mtmp, muse_newcham_mon(mtmp), TRUE, FALSE);
		if (oseen) makeknown(WAN_POLYMORPH);
		return 2;
	case MUSE_POT_POLYMORPH:
		mquaffmsg(mtmp, otmp);
		if (vismon) pline("%s suddenly mutates!", Monnam(mtmp));
		newcham(level, mtmp, muse_newcham_mon(mtmp), FALSE, FALSE);
		if (oseen) makeknown(POT_POLYMORPH);
		m_useup(mtmp, otmp);
		return 2;
	case MUSE_POLY_TRAP:
		if (vismon)
		    pline("%s deliberately %s onto a polymorph trap!",
			Monnam(mtmp),
			makeplural(locomotion(mtmp->data, "jump")));
		if (vis) seetrap(t_at(level, trapx,trapy));

		/*  don't use rloc() due to worms */
		remove_monster(level, mtmp->mx, mtmp->my);
		newsym(mtmp->mx, mtmp->my);
		place_monster(mtmp, trapx, trapy);
		if (mtmp->wormno) worm_move(mtmp);
		newsym(trapx, trapy);

		newcham(level, mtmp, NULL, FALSE, FALSE);
		return 2;
	case MUSE_BULLWHIP:
		/* attempt to disarm hero */
		if (uwep && !rn2(5)) {
		    const char *The_whip = vismon ? "The bullwhip" : "A whip";
		    int where_to = rn2(4);
		    struct obj *obj = uwep;
		    const char *hand;
		    char the_weapon[BUFSZ];

		    strcpy(the_weapon, the(xname(obj)));
		    hand = body_part(HAND);
		    if (bimanual(obj)) hand = makeplural(hand);

		    if (vismon)
			pline("%s flicks a bullwhip towards your %s!",
			      Monnam(mtmp), hand);
		    if (obj->otyp == HEAVY_IRON_BALL) {
			pline("%s fails to wrap around %s.",
			      The_whip, the_weapon);
			return 1;
		    }
		    pline("%s wraps around %s you're wielding!",
			  The_whip, the_weapon);
		    if (welded(obj)) {
			pline("%s welded to your %s%c",
			      !is_plural(obj) ? "It is" : "They are",
			      hand, !obj->bknown ? '!' : '.');
			/* obj->bknown = 1; */ /* welded() takes care of this */
			where_to = 0;
		    }
		    if (!where_to) {
			pline("The whip slips free.");  /* not `The_whip' */
			return 1;
		    } else if (where_to == 3 && hates_silver(mtmp->data) &&
			    objects[obj->otyp].oc_material == SILVER) {
			/* this monster won't want to catch a silver
			   weapon; drop it at hero's feet instead */
			where_to = 2;
		    }
		    freeinv(obj);
		    uwepgone();
		    switch (where_to) {
			case 1:		/* onto floor beneath mon */
			    pline("%s yanks %s from your %s!", Monnam(mtmp),
				  the_weapon, hand);
			    place_object(obj, level, mtmp->mx, mtmp->my);
			    break;
			case 2:		/* onto floor beneath you */
			    pline("%s yanks %s to the %s!", Monnam(mtmp),
				  the_weapon, surface(u.ux, u.uy));
			    dropy(obj);
			    break;
			case 3:		/* into mon's inventory */
			    pline("%s snatches %s!", Monnam(mtmp),
				  the_weapon);
			    mpickobj(mtmp,obj);
			    break;
		    }
		    return 1;
		}
		return 0;
	case 0: return 0; /* i.e. an exploded wand */
	default: warning("%s wanted to perform action %d?", Monnam(mtmp),
			 m->has_misc);
		break;
	}
	return 0;
}